

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O3

uint64_t basisu::pack_eac_a8(pack_eac_a8_results *results,uint8_t *pPixels,uint32_t num_pixels,
                            uint32_t base_search_rad,uint32_t mul_search_rad,uint32_t table_mask)

{
  uint8_vec *this;
  uint8_vec *this_00;
  uint8_vec uVar1;
  byte bVar2;
  undefined4 uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  uint32_t uVar18;
  ulong uVar19;
  undefined4 *puVar20;
  ulong uVar21;
  uint uVar22;
  uint32_t uVar23;
  uint32_t uVar24;
  uint uVar25;
  bool bVar26;
  undefined4 in_XMM2_Db;
  uint in_XMM2_Dc;
  uint in_XMM2_Dd;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [16];
  uint32_t new_size;
  
  this = &results->m_selectors;
  uVar7 = (results->m_selectors).m_size;
  if (uVar7 != num_pixels) {
    if (uVar7 <= num_pixels) {
      if ((results->m_selectors).m_capacity < num_pixels) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this,num_pixels,uVar7 + 1 == num_pixels,1,(object_mover)0x0,
                   false);
        uVar7 = (results->m_selectors).m_size;
      }
      memset(this->m_p + uVar7,0,(ulong)(num_pixels - uVar7));
    }
    (results->m_selectors).m_size = num_pixels;
  }
  this_00 = &results->m_selectors_temp;
  uVar7 = (results->m_selectors_temp).m_size;
  if (uVar7 != num_pixels) {
    if (uVar7 <= num_pixels) {
      if ((results->m_selectors_temp).m_capacity < num_pixels) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,num_pixels,uVar7 + 1 == num_pixels,1,
                   (object_mover)0x0,false);
        uVar7 = (results->m_selectors_temp).m_size;
      }
      memset(this_00->m_p + uVar7,0,(ulong)(num_pixels - uVar7));
    }
    (results->m_selectors_temp).m_size = num_pixels;
  }
  auVar6 = _DAT_002778f0;
  if (num_pixels == 0) {
    uVar11 = 0;
    uVar7 = 0xff;
  }
  else {
    uVar19 = 0;
    uVar7 = 0xff;
    uVar11 = 0;
    do {
      bVar2 = pPixels[uVar19];
      if (bVar2 <= uVar7) {
        uVar7 = (uint)bVar2;
      }
      uVar22 = (uint)bVar2;
      if (bVar2 < uVar11) {
        uVar22 = uVar11;
      }
      uVar11 = uVar22;
      uVar19 = uVar19 + 1;
    } while (num_pixels != uVar19);
    if (uVar7 == uVar11) {
      results->m_base = uVar11;
      results->m_table = 0xd;
      results->m_multiplier = 1;
      if (num_pixels == 0) {
        return 0;
      }
      uVar19 = 0;
      while (uVar19 < (results->m_selectors).m_size) {
        this->m_p[uVar19] = '\x04';
        uVar19 = uVar19 + 1;
        if (num_pixels == uVar19) {
          return 0;
        }
      }
LAB_00227e60:
      __assert_fail("i < m_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                    ,0x178,
                    "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]");
    }
  }
  uVar19 = 0xffffffffffffffff;
  puVar20 = &g_etc2_eac_tables;
  lVar17 = 0;
  do {
    if ((table_mask >> ((uint)lVar17 & 0x1f) & 1) != 0) {
      iVar12 = (int)*(char *)((long)&g_etc2_eac_tables + lVar17 * 8 + 3);
      fVar27 = (float)(*(char *)((long)&DAT_0031bd14 + lVar17 * 8 + 3) - iVar12);
      fVar30 = ((float)-iVar12 / fVar27) * ((float)uVar11 - (float)uVar7) + (float)uVar7;
      auVar31 = ZEXT416((uint)fVar30 & 0x80000000) | auVar6;
      auVar31._0_4_ = auVar31._0_4_ + fVar30;
      auVar31 = roundss(ZEXT816(0),auVar31,0xb);
      uVar13 = (int)auVar31._0_4_ - base_search_rad;
      uVar22 = (int)~uVar13 >> 0x1f;
      if (uVar13 < 0x100) {
        uVar22 = uVar13;
      }
      uVar22 = uVar22 & 0xff;
      uVar8 = (int)auVar31._0_4_ + base_search_rad;
      uVar13 = (int)~uVar8 >> 0x1f;
      if (uVar8 < 0x100) {
        uVar13 = uVar8;
      }
      fVar27 = (float)(uVar11 - uVar7) / fVar27;
      auVar28._0_8_ = CONCAT44(in_XMM2_Db,fVar27) & 0x8000000080000000;
      auVar28._8_4_ = in_XMM2_Dc & 0x80000000;
      auVar28._12_4_ = in_XMM2_Dd & 0x80000000;
      auVar28 = auVar28 | auVar6;
      auVar29._4_12_ = auVar28._4_12_;
      auVar29._0_4_ = auVar28._0_4_ + fVar27;
      auVar31 = roundss(auVar29,auVar29,0xb);
      uVar23 = (int)auVar31._0_4_ - mul_search_rad;
      if (0xe < (int)uVar23) {
        uVar23 = 0xf;
      }
      uVar18 = 1;
      if (1 < (int)uVar23) {
        uVar18 = uVar23;
      }
      iVar12 = (int)auVar31._0_4_ + mul_search_rad;
      if (0xe < iVar12) {
        iVar12 = 0xf;
      }
      if (uVar22 <= (uVar13 & 0xff)) {
        iVar9 = 1;
        if (1 < iVar12) {
          iVar9 = iVar12;
        }
        do {
          uVar24 = uVar18;
          if ((int)uVar23 <= iVar9) {
            do {
              if (num_pixels == 0) {
                uVar10 = 0;
              }
              else {
                uVar8 = 0;
                uVar10 = 0;
                do {
                  uVar15 = 0xffffffff;
                  uVar21 = 0;
                  uVar14 = 0;
                  do {
                    uVar25 = (int)*(char *)((long)puVar20 + uVar21) * uVar24 + uVar22;
                    uVar16 = (int)~uVar25 >> 0x1f;
                    if (uVar25 < 0x100) {
                      uVar16 = uVar25;
                    }
                    uVar25 = (uint)pPixels[uVar8] - (uVar16 & 0xff);
                    uVar16 = -uVar25;
                    if (0 < (int)uVar25) {
                      uVar16 = uVar25;
                    }
                    if (uVar16 < uVar15) {
                      uVar14 = uVar21 & 0xffffffff;
                      uVar15 = uVar16;
                    }
                    uVar21 = uVar21 + 1;
                  } while (uVar21 != 8);
                  if ((results->m_selectors_temp).m_size <= uVar8) goto LAB_00227e60;
                  this_00->m_p[uVar8] = (uchar)uVar14;
                  uVar10 = uVar10 + uVar15 * uVar15;
                } while ((uVar10 < uVar19) && (uVar8 = uVar8 + 1, uVar8 < num_pixels));
              }
              if (uVar10 < uVar19) {
                results->m_base = uVar22;
                results->m_multiplier = uVar24;
                results->m_table = (uint)lVar17;
                uVar1 = results->m_selectors;
                uVar3 = *(undefined4 *)((long)&(results->m_selectors_temp).m_p + 4);
                uVar4 = (results->m_selectors_temp).m_size;
                uVar5 = (results->m_selectors_temp).m_capacity;
                *(undefined4 *)&(results->m_selectors).m_p =
                     *(undefined4 *)&(results->m_selectors_temp).m_p;
                *(undefined4 *)((long)&(results->m_selectors).m_p + 4) = uVar3;
                (results->m_selectors).m_size = uVar4;
                (results->m_selectors).m_capacity = uVar5;
                results->m_selectors_temp = uVar1;
                uVar19 = uVar10;
                if (uVar10 == 0) {
                  return 0;
                }
              }
              bVar26 = (int)uVar24 < iVar12;
              uVar24 = uVar24 + 1;
            } while (bVar26);
          }
          bVar26 = uVar22 != (uVar13 & 0xff);
          uVar22 = uVar22 + 1;
        } while (bVar26);
      }
    }
    lVar17 = lVar17 + 1;
    puVar20 = puVar20 + 2;
    if (lVar17 == 0x10) {
      return uVar19;
    }
  } while( true );
}

Assistant:

uint64_t pack_eac_a8(pack_eac_a8_results& results, const uint8_t* pPixels, uint32_t num_pixels, uint32_t base_search_rad, uint32_t mul_search_rad, uint32_t table_mask)
	{
		results.m_selectors.resize(num_pixels);
		results.m_selectors_temp.resize(num_pixels);

		uint32_t min_alpha = 255, max_alpha = 0;
		for (uint32_t i = 0; i < num_pixels; i++)
		{
			const uint32_t a = pPixels[i];
			if (a < min_alpha) min_alpha = a;
			if (a > max_alpha) max_alpha = a;
		}

		if (min_alpha == max_alpha)
		{
			results.m_base = min_alpha;
			results.m_table = 13;
			results.m_multiplier = 1;
			for (uint32_t i = 0; i < num_pixels; i++)
				results.m_selectors[i] = 4;
			return 0;
		}

		const uint32_t alpha_range = max_alpha - min_alpha;

		uint64_t best_err = UINT64_MAX;

		for (uint32_t table = 0; table < 16; table++)
		{
			if ((table_mask & (1U << table)) == 0)
				continue;

			const float range = (float)(g_etc2_eac_tables[table][ETC2_EAC_MAX_VALUE_SELECTOR] - g_etc2_eac_tables[table][ETC2_EAC_MIN_VALUE_SELECTOR]);
			const int center = (int)roundf(lerp((float)min_alpha, (float)max_alpha, (float)(0 - g_etc2_eac_tables[table][ETC2_EAC_MIN_VALUE_SELECTOR]) / range));

			const int base_min = clamp255(center - base_search_rad);
			const int base_max = clamp255(center + base_search_rad);

			const int mul = (int)roundf(alpha_range / range);
			const int mul_low = clamp<int>(mul - mul_search_rad, 1, 15);
			const int mul_high = clamp<int>(mul + mul_search_rad, 1, 15);

			for (int base = base_min; base <= base_max; base++)
			{
				for (int multiplier = mul_low; multiplier <= mul_high; multiplier++)
				{
					uint64_t total_err = 0;

					for (uint32_t i = 0; i < num_pixels; i++)
					{
						const int a = pPixels[i];

						uint32_t best_s_err = UINT32_MAX;
						uint32_t best_s = 0;
						for (uint32_t s = 0; s < 8; s++)
						{
							const int v = clamp255((int)multiplier * g_etc2_eac_tables[table][s] + (int)base);

							uint32_t err = iabs(a - v);
							if (err < best_s_err)
							{
								best_s_err = err;
								best_s = s;
							}
						}

						results.m_selectors_temp[i] = static_cast<uint8_t>(best_s);

						total_err += best_s_err * best_s_err;
						if (total_err >= best_err)
							break;
					}

					if (total_err < best_err)
					{
						best_err = total_err;
						results.m_base = base;
						results.m_multiplier = multiplier;
						results.m_table = table;
						results.m_selectors.swap(results.m_selectors_temp);
						if (!best_err)
							return best_err;
					}

				} // table

			} // multiplier

		} // base

		return best_err;
	}